

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportMan.cpp
# Opt level: O2

void __thiscall
adios2::transportman::TransportMan::OpenFileID
          (TransportMan *this,string *name,size_t id,Mode mode,Params *parameters,bool profile)

{
  __hashtable *__h;
  shared_ptr<adios2::Transport> file;
  undefined1 local_60 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50 [4];
  
  helper::LowerCaseParams((Params *)local_60,parameters);
  OpenFileTransport((TransportMan *)&file,(string *)this,(Mode)name,(Params *)(ulong)mode,
                    SUB81((Params *)local_60,0),profile,(Comm *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_60);
  local_60._0_8_ = id;
  std::__shared_ptr<adios2::Transport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<adios2::Transport,_(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8),
             &file.super___shared_ptr<adios2::Transport,_(__gnu_cxx::_Lock_policy)2>);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<adios2::Transport>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<adios2::Transport>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_long_const,std::shared_ptr<adios2::Transport>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<adios2::Transport>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<adios2::Transport>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->m_Transports,local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&file.super___shared_ptr<adios2::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void TransportMan::OpenFileID(const std::string &name, const size_t id, const Mode mode,
                              const Params &parameters, const bool profile)
{
    std::shared_ptr<Transport> file =
        OpenFileTransport(name, mode, helper::LowerCaseParams(parameters), profile, false, m_Comm);
    m_Transports.insert({id, file});
}